

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase *
EvaluateFunction(ExpressionEvalContext *ctx,ExprFunctionDefinition *expression,ExprBase *context,
                ArrayView<ExprBase_*> arguments)

{
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *this;
  uint uVar1;
  Allocator *pAVar2;
  VariableData *pVVar3;
  StackVariable *pSVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprPointerLiteral *pEVar8;
  ExprBase *pEVar9;
  ExprBase *pEVar10;
  char *pcVar11;
  ulong uVar12;
  ExprVariableDefinition *pEVar13;
  StackFrame *pSVar7;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    if ((ctx->stackFrames).count < ctx->stackDepthLimit) {
      this = &ctx->stackFrames;
      iVar6 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
      pSVar7 = (StackFrame *)CONCAT44(extraout_var,iVar6);
      pAVar2 = ctx->ctx->allocator;
      pSVar7->owner = expression->function;
      pSVar4 = (pSVar7->variables).little;
      memset(pSVar4,0,0x200);
      (pSVar7->variables).allocator = pAVar2;
      (pSVar7->variables).data = pSVar4;
      (pSVar7->variables).count = 0;
      (pSVar7->variables).max = 0x20;
      pSVar7->returnValue = (ExprBase *)0x0;
      pSVar7->targetYield = 0;
      pSVar7->breakDepth = 0;
      pSVar7->continueDepth = 0;
      uVar1 = (ctx->stackFrames).count;
      if (uVar1 == (ctx->stackFrames).max) {
        SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::grow(this,uVar1);
      }
      if (this->data == (StackFrame **)0x0) {
        pcVar11 = 
        "void SmallArray<ExpressionEvalContext::StackFrame *, 32>::push_back(const T &) [T = ExpressionEvalContext::StackFrame *, N = 32]"
        ;
LAB_00139e75:
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,pcVar11);
      }
      uVar1 = (ctx->stackFrames).count;
      (ctx->stackFrames).count = uVar1 + 1;
      this->data[uVar1] = pSVar7;
      if (uVar1 + 1 == 0) {
        __assert_fail("count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x172,
                      "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                     );
      }
      pSVar7 = this->data[uVar1];
      pEVar13 = expression->contextArgument;
      if (pEVar13 != (ExprVariableDefinition *)0x0) {
        pEVar8 = AllocateTypeStorage(ctx,(pEVar13->super_ExprBase).source,
                                     pEVar13->variable->variable->type);
        if (pEVar8 == (ExprPointerLiteral *)0x0) {
          return (ExprBase *)0x0;
        }
        pVVar3 = pEVar13->variable->variable;
        uVar1 = (pSVar7->variables).count;
        if (uVar1 == (pSVar7->variables).max) {
          SmallArray<ExpressionEvalContext::StackVariable,_32U>::grow(&pSVar7->variables,uVar1);
        }
        pSVar4 = (pSVar7->variables).data;
        if (pSVar4 == (StackVariable *)0x0) {
LAB_00139e0b:
          pcVar11 = 
          "void SmallArray<ExpressionEvalContext::StackVariable, 32>::push_back(const T &) [T = ExpressionEvalContext::StackVariable, N = 32]"
          ;
          goto LAB_00139e75;
        }
        uVar1 = (pSVar7->variables).count;
        (pSVar7->variables).count = uVar1 + 1;
        pSVar4[uVar1].variable = pVVar3;
        pSVar4[uVar1].ptr = pEVar8;
        bVar5 = CreateStore(ctx,&pEVar8->super_ExprBase,context);
        if (!bVar5) {
          return (ExprBase *)0x0;
        }
      }
      pEVar13 = (expression->arguments).head;
      if (pEVar13 != (ExprVariableDefinition *)0x0) {
        uVar12 = 0;
        do {
          pEVar8 = AllocateTypeStorage(ctx,(pEVar13->super_ExprBase).source,
                                       pEVar13->variable->variable->type);
          if (pEVar8 == (ExprPointerLiteral *)0x0) {
            return (ExprBase *)0x0;
          }
          pVVar3 = pEVar13->variable->variable;
          uVar1 = (pSVar7->variables).count;
          if (uVar1 == (pSVar7->variables).max) {
            SmallArray<ExpressionEvalContext::StackVariable,_32U>::grow(&pSVar7->variables,uVar1);
          }
          pSVar4 = (pSVar7->variables).data;
          if (pSVar4 == (StackVariable *)0x0) goto LAB_00139e0b;
          uVar1 = (pSVar7->variables).count;
          (pSVar7->variables).count = uVar1 + 1;
          pSVar4[uVar1].variable = pVVar3;
          pSVar4[uVar1].ptr = pEVar8;
          if (arguments.count == uVar12) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x22a,
                          "T &ArrayView<ExprBase *>::operator[](unsigned int) [T = ExprBase *]");
          }
          bVar5 = CreateStore(ctx,&pEVar8->super_ExprBase,arguments.data[uVar12]);
          if (!bVar5) {
            return (ExprBase *)0x0;
          }
          pEVar13 = (ExprVariableDefinition *)(pEVar13->super_ExprBase).next;
        } while ((pEVar13 != (ExprVariableDefinition *)0x0) &&
                (uVar12 = uVar12 + 1, (pEVar13->super_ExprBase).typeID == 0x1e));
      }
      if (expression->coroutineStateRead != (ExprBase *)0x0) {
        pEVar9 = Evaluate(ctx,expression->coroutineStateRead);
        if ((pEVar9 == (ExprBase *)0x0) || (pEVar9->typeID != 6)) {
          return (ExprBase *)0x0;
        }
        pSVar7->targetYield = *(uint *)&pEVar9[1]._vptr_ExprBase;
      }
      pEVar9 = (expression->expressions).head;
      if (pEVar9 == (ExprBase *)0x0) {
        pEVar10 = pSVar7->returnValue;
        if (pEVar10 != (ExprBase *)0x0) {
LAB_00139de3:
          uVar1 = (ctx->stackFrames).count;
          if (uVar1 == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x183,
                          "void SmallArray<ExpressionEvalContext::StackFrame *, 32>::pop_back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                         );
          }
          (ctx->stackFrames).count = uVar1 - 1;
          return pEVar10;
        }
      }
      else {
        do {
          pEVar10 = Evaluate(ctx,pEVar9);
          if (pEVar10 == (ExprBase *)0x0) {
            return (ExprBase *)0x0;
          }
          if ((pSVar7->breakDepth != 0) || (pSVar7->continueDepth != 0)) {
            __assert_fail("frame->breakDepth == 0 && frame->continueDepth == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,2000,
                          "ExprBase *EvaluateFunction(ExpressionEvalContext &, ExprFunctionDefinition *, ExprBase *, ArrayView<ExprBase *>)"
                         );
          }
          pEVar10 = pSVar7->returnValue;
          if (pEVar10 != (ExprBase *)0x0) goto LAB_00139de3;
          pEVar9 = pEVar9->next;
        } while (pEVar9 != (ExprBase *)0x0);
      }
      ReportCritical(ctx,"ERROR: function didn\'t return a value");
      return (ExprBase *)0x0;
    }
    pcVar11 = "ERROR: stack depth limit";
  }
  else {
    pcVar11 = "ERROR: instruction limit reached";
  }
  Report(ctx,pcVar11);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateFunction(ExpressionEvalContext &ctx, ExprFunctionDefinition *expression, ExprBase *context, ArrayView<ExprBase*> arguments)
{
	if(!AddInstruction(ctx))
		return NULL;

	if(ctx.stackFrames.size() >= ctx.stackDepthLimit)
		return Report(ctx, "ERROR: stack depth limit");

	ctx.stackFrames.push_back(new (ctx.ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.ctx.allocator, expression->function));

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(ExprVariableDefinition *curr = expression->contextArgument)
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, context))
			return NULL;
	}

	unsigned pos = 0;

	for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, arguments[pos]))
			return NULL;

		pos++;
	}

	if(expression->coroutineStateRead)
	{
		if(ExprIntegerLiteral *jmpOffset = getType<ExprIntegerLiteral>(Evaluate(ctx, expression->coroutineStateRead)))
		{
			frame->targetYield = unsigned(jmpOffset->value);
		}
		else
		{
			return NULL;
		}
	}

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		assert(frame->breakDepth == 0 && frame->continueDepth == 0);

		if(frame->returnValue)
			break;
	}

	ExprBase *result = frame->returnValue;

	if(!result)
		return ReportCritical(ctx, "ERROR: function didn't return a value");

	ctx.stackFrames.pop_back();

	return result;
}